

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * lexer::terminalName(string *__return_storage_ptr__,Terminal terminal,
                            TerminalNames *terminalNames)

{
  const_iterator cVar1;
  stringstream stringstream;
  Terminal local_19c;
  stringstream local_198 [16];
  ostream local_188 [376];
  
  local_19c = terminal;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&terminalNames->_M_t,&local_19c);
  if ((_Rb_tree_header *)cVar1._M_node == &(terminalNames->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::ostream::operator<<(local_188,local_19c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&cVar1._M_node[1]._M_parent);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string terminalName(Terminal terminal, TerminalNames const& terminalNames) {
        TerminalNames::const_iterator it = terminalNames.find(terminal);
        if (it == terminalNames.end()) {
            std::stringstream stringstream;
            stringstream << terminal;
            return stringstream.str();
        }
        return it->second;
    }